

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O1

void __thiscall
limonp::LocalVector<cppjieba::RuneStr>::reserve(LocalVector<cppjieba::RuneStr> *this,size_t size)

{
  ulong uVar1;
  LocalVector<cppjieba::RuneStr> *__src;
  RuneStr *__dest;
  
  uVar1 = this->capacity_;
  if (uVar1 < size) {
    __dest = (RuneStr *)malloc(size * 0x14);
    if (__dest == (RuneStr *)0x0) {
      __assert_fail("next",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/limonp/LocalVector.hpp"
                    ,0x5c,
                    "void limonp::LocalVector<cppjieba::RuneStr>::reserve(size_t) [T = cppjieba::RuneStr]"
                   );
    }
    __src = (LocalVector<cppjieba::RuneStr> *)this->ptr_;
    this->ptr_ = __dest;
    memcpy(__dest,__src,uVar1 * 0x14);
    this->capacity_ = size;
    if (__src != this) {
      free(__src);
      return;
    }
  }
  return;
}

Assistant:

void reserve(size_t size) {
    if(size <= capacity_) {
      return;
    }
    T * next =  (T*)malloc(sizeof(T) * size);
    assert(next);
    T * old = ptr_;
    ptr_ = next;
    memcpy(ptr_, old, sizeof(T) * capacity_);
    capacity_ = size;
    if(old != buffer_) {
      free(old);
    }
  }